

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  pointer pcVar1;
  cmake *pcVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  char **ppcVar5;
  string *psVar6;
  ostream *poVar7;
  size_t sVar8;
  char **ppcVar9;
  bool bVar10;
  char **ppcVar11;
  bool needCxx20;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  ostringstream e;
  bool local_225;
  bool local_224;
  bool local_223;
  bool local_222;
  bool local_221;
  string local_220;
  cmTarget *local_200;
  cmMakefile *local_1f8;
  string *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_221 = false;
  local_222 = false;
  local_223 = false;
  local_224 = false;
  local_225 = false;
  CheckNeededCxxLanguage(this,feature,&local_221,&local_222,&local_223,&local_224,&local_225);
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CXX_STANDARD","");
  pcVar4 = cmTarget::GetProperty(target,(string *)local_1a8);
  local_1f8 = this;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1f0 = error;
  if (pcVar4 == (char *)0x0) {
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_CXX_STANDARD_DEFAULT","");
    psVar6 = GetDef(local_1f8,(string *)local_1a8);
    if (psVar6 == (string *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (psVar6->_M_dataplus)._M_p;
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) goto LAB_001d690c;
    ppcVar5 = (char **)0x0;
LAB_001d6a88:
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CUDA_STANDARD","");
    pcVar4 = cmTarget::GetProperty(target,(string *)local_1a8);
    local_200 = target;
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar4 == (char *)0x0) {
      ppcVar9 = (char **)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,pcVar4,(allocator<char> *)local_1a8);
      ppcVar9 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                           (cmStrCmp *)local_1e8);
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      if (ppcVar9 == (char **)&cmMSVC60LinkLineComputer::vtable) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The CUDA_STANDARD property on target \"",0x26);
        psVar6 = cmTarget::GetName_abi_cxx11_(local_200);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\" contained an invalid value: \"",0x1f);
        sVar8 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar4,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
        psVar6 = local_1f0;
        pcVar3 = local_1f8;
        if (local_1f0 != (string *)0x0) {
          std::__cxx11::stringbuf::str();
          goto LAB_001d6be7;
        }
        pcVar2 = local_1f8->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_220,&pcVar3->Backtrace);
        goto LAB_001d6cd3;
      }
    }
    if (local_225 == false) {
      if (local_224 == false) {
        if (local_223 == false) {
          if (local_222 == false) {
            if (local_221 != true) {
              return true;
            }
            ppcVar11 = CXX_STANDARDS;
          }
          else {
            ppcVar11 = CXX_STANDARDS + 1;
          }
        }
        else {
          ppcVar11 = CXX_STANDARDS + 2;
        }
      }
      else {
        ppcVar11 = CXX_STANDARDS + 3;
      }
    }
    else {
      ppcVar11 = CXX_STANDARDS + 4;
    }
    if (ppcVar5 < ppcVar11) {
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CXX_STANDARD","");
      cmTarget::SetProperty(local_200,(string *)local_1a8,*ppcVar11);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    bVar10 = true;
    if (ppcVar9 < ppcVar11) {
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CUDA_STANDARD","");
      cmTarget::SetProperty(local_200,(string *)local_1a8,*ppcVar11);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
  }
  else {
LAB_001d690c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,pcVar4,(allocator<char> *)local_1a8);
    ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                         (cmStrCmp *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (ppcVar5 != (char **)&cmMSVC60LinkLineComputer::vtable) goto LAB_001d6a88;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The CXX_STANDARD property on target \"",0x25);
    pcVar3 = local_1f8;
    psVar6 = cmTarget::GetName_abi_cxx11_(target);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\" contained an invalid value: \"",0x1f);
    sVar8 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar4,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    psVar6 = local_1f0;
    if (local_1f0 == (string *)0x0) {
      pcVar2 = pcVar3->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_220,&pcVar3->Backtrace);
    }
    else {
      std::__cxx11::stringbuf::str();
LAB_001d6be7:
      std::__cxx11::string::operator=((string *)psVar6,(string *)&local_220);
    }
LAB_001d6cd3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool cmMakefile::AddRequiredTargetCxxFeature(cmTarget* target,
                                             const std::string& feature,
                                             std::string* error) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;
  bool needCxx20 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17, needCxx20);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard == nullptr) {
    const char* defaultCxxStandard =
      this->GetDefinition("CMAKE_CXX_STANDARD_DEFAULT");
    if (defaultCxxStandard && *defaultCxxStandard) {
      existingCxxStandard = defaultCxxStandard;
    }
  }
  const char* const* existingCxxLevel = nullptr;
  if (existingCxxStandard) {
    existingCxxLevel =
      std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(existingCxxStandard));
    if (existingCxxLevel == cm::cend(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }

  const char* existingCudaStandard = target->GetProperty("CUDA_STANDARD");
  const char* const* existingCudaLevel = nullptr;
  if (existingCudaStandard) {
    existingCudaLevel =
      std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(existingCudaStandard));
    if (existingCudaLevel == cm::cend(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CUDA_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCudaStandard
        << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }

  /* clang-format off */
  const char* const* needCxxLevel =
    needCxx20 ? &CXX_STANDARDS[4]
    : needCxx17 ? &CXX_STANDARDS[3]
    : needCxx14 ? &CXX_STANDARDS[2]
    : needCxx11 ? &CXX_STANDARDS[1]
    : needCxx98 ? &CXX_STANDARDS[0]
    : nullptr;
  /* clang-format on */

  if (needCxxLevel) {
    // Ensure the C++ language level is high enough to support
    // the needed C++ features.
    if (!existingCxxLevel || existingCxxLevel < needCxxLevel) {
      target->SetProperty("CXX_STANDARD", *needCxxLevel);
    }

    // Ensure the CUDA language level is high enough to support
    // the needed C++ features.
    if (!existingCudaLevel || existingCudaLevel < needCxxLevel) {
      target->SetProperty("CUDA_STANDARD", *needCxxLevel);
    }
  }

  return true;
}